

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::writePCR(TSMuxer *this,int64_t newPCR)

{
  int iVar1;
  int local_24;
  int tsFrames;
  int expectedBits;
  int bitsRest;
  int64_t newPCR_local;
  TSMuxer *this_local;
  
  tsFrames = 0;
  if (((this->m_cbrBitrate != -1) && (this->m_minBitrate != -1)) && (this->m_lastPCR != -1)) {
    iVar1 = lroundl();
    iVar1 = iVar1 - this->m_pcrBits;
    if (0 < iVar1) {
      local_24 = (int)((long)((ulong)(uint)((int)((long)iVar1 / 8) >> 0x1f) << 0x20 |
                             (long)iVar1 / 8 & 0xffffffffU) / (long)this->m_frameSize);
      if (local_24 * this->m_frameSize * 8 < iVar1) {
        local_24 = local_24 + 1;
      }
      writeNullPackets(this,local_24);
      if (this->m_cbrBitrate == this->m_minBitrate) {
        tsFrames = local_24 * this->m_frameSize * 8 - iVar1;
      }
    }
  }
  this->m_pcrBits = tsFrames;
  writeEmptyPacketWithPCR(this,newPCR);
  this->m_lastPCR = newPCR;
  return;
}

Assistant:

void TSMuxer::writePCR(const int64_t newPCR)
{
    int bitsRest = 0;
    if (m_cbrBitrate != -1 && m_minBitrate != -1 && m_lastPCR != -1)
    {
        int expectedBits = lroundl(static_cast<double>(newPCR - m_lastPCR) / 90000.0 * m_minBitrate);
        expectedBits -= m_pcrBits;
        if (expectedBits > 0)
        {
            int tsFrames = expectedBits / 8 / m_frameSize;
            if (tsFrames * m_frameSize * 8 < expectedBits)
                tsFrames++;
            writeNullPackets(tsFrames);
            if (m_cbrBitrate == m_minBitrate)
                bitsRest = (tsFrames * m_frameSize * 8) - expectedBits;
        }
    }
    m_pcrBits = bitsRest;
    // assert(m_pcrBits % 8 == 0);
    writeEmptyPacketWithPCR(newPCR);
    m_lastPCR = newPCR;
}